

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O1

ssize_t sf_parse_bare_item(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  uint8_t *puVar1;
  byte bVar2;
  uint8_t uVar3;
  byte *pbVar4;
  ssize_t sVar5;
  long lVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  int iVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  
  bVar2 = *begin;
  switch(bVar2) {
  case 0x22:
    pbVar8 = begin + 1;
    pbVar4 = (byte *)0xffffffffffffffff;
    pbVar11 = pbVar8;
    if (pbVar8 != end && bVar2 == 0x22) {
      do {
        bVar2 = *pbVar11;
        if (bVar2 == 0x5c) {
          pbVar11 = pbVar11 + 1;
          if (pbVar11 == end) {
            return -1;
          }
          if ((*pbVar11 != 0x22) && (*pbVar11 != 0x5c)) {
            return -1;
          }
        }
        else {
          if (bVar2 == 0x22) {
            if (dest != (nghttp2_sf_value *)0x0) {
              dest->type = '\x03';
              (dest->field_1).s.base = pbVar8;
              (dest->field_1).s.len = (long)pbVar11 - (long)pbVar8;
            }
            return (ssize_t)(pbVar11 + (1 - (long)begin));
          }
          if (SF_DQUOTE_CHARS[bVar2] == 0) {
            return -1;
          }
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != end);
    }
    break;
  default:
    pbVar4 = (byte *)0xffffffffffffffff;
    if ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) goto switchD_0053ba75_caseD_2a;
    break;
  case 0x2a:
switchD_0053ba75_caseD_2a:
    sVar5 = sf_parse_token(dest,begin,end);
    return sVar5;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    iVar7 = 1;
    pbVar8 = begin;
    if (bVar2 == 0x2d) {
      pbVar8 = begin + 1;
      iVar7 = -1;
      if (pbVar8 == end) goto LAB_0053bc77;
    }
    pbVar4 = (byte *)0xffffffffffffffff;
    if (0xf5 < (byte)(*pbVar8 - 0x3a)) {
      if (pbVar8 == end) {
        bVar14 = true;
        lVar6 = 0;
        uVar12 = 0;
        uVar13 = 0;
      }
      else {
        iVar10 = 1;
        uVar13 = 0;
        uVar12 = 0;
        lVar6 = 0;
        pbVar4 = pbVar8;
        do {
          bVar2 = *pbVar4;
          if (bVar2 - 0x30 < 10) {
            if (0xe < uVar12) {
              return -1;
            }
            lVar6 = (ulong)bVar2 + lVar6 * 10 + -0x30;
            uVar12 = uVar12 + 1;
          }
          else {
            pbVar8 = pbVar4;
            if (bVar2 != 0x2e) break;
            if (iVar10 != 1) goto LAB_0053bb41;
            iVar10 = 2;
            uVar13 = uVar12;
            if (0xc < uVar12) {
              return -1;
            }
          }
          pbVar4 = pbVar4 + 1;
          pbVar8 = end;
        } while (pbVar4 != end);
        bVar14 = iVar10 == 1;
      }
      pbVar4 = pbVar8;
      if (bVar14) {
        if (dest != (nghttp2_sf_value *)0x0) {
          dest->type = '\x01';
          (dest->field_1).i = lVar6 * iVar7;
        }
      }
      else {
LAB_0053bb41:
        lVar9 = uVar13 - uVar12;
        if (lVar9 == 0) {
          return -1;
        }
        if (3 < uVar12 - uVar13) {
          return -1;
        }
        if (dest != (nghttp2_sf_value *)0x0) {
          dest->type = '\x02';
          dVar15 = (double)lVar6;
          (dest->field_1).d = dVar15;
          if (uVar12 != uVar13) {
            do {
              dVar15 = dVar15 / 10.0;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0);
            (dest->field_1).d = dVar15;
          }
          (dest->field_1).d = (double)iVar7 * (dest->field_1).d;
        }
      }
      pbVar4 = pbVar4 + -(long)begin;
    }
    break;
  case 0x3a:
    if (begin + 1 != end && bVar2 == 0x3a) {
      lVar6 = 2;
      do {
        if ((ulong)begin[lVar6 + -1] == 0x3a) {
          if (dest == (nghttp2_sf_value *)0x0) {
            return lVar6;
          }
          dest->type = '\x05';
          (dest->field_1).s.base = begin + 1;
          (dest->field_1).s.len = lVar6 - 2;
          return lVar6;
        }
      } while ((SF_BYTESEQ_CHARS[begin[lVar6 + -1]] != 0) &&
              (puVar1 = begin + lVar6, lVar6 = lVar6 + 1, puVar1 != end));
    }
LAB_0053bc77:
    pbVar4 = (byte *)0xffffffffffffffff;
    break;
  case 0x3f:
    pbVar4 = (byte *)0xffffffffffffffff;
    if (begin + 1 != end && bVar2 == 0x3f) {
      uVar3 = begin[1];
      if (uVar3 == '0') {
        iVar7 = 0;
      }
      else {
        if (uVar3 != '1') {
          return -1;
        }
        iVar7 = 1;
      }
      pbVar4 = (byte *)0x2;
      if (dest != (nghttp2_sf_value *)0x0) {
        dest->type = '\0';
        (dest->field_1).b = iVar7;
      }
    }
  }
  return (ssize_t)pbVar4;
}

Assistant:

static ssize_t sf_parse_bare_item(nghttp2_sf_value *dest, const uint8_t *begin,
                                  const uint8_t *end) {
  switch (*begin) {
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    return sf_parse_integer_or_decimal(dest, begin, end);
  case '"':
    return sf_parse_string(dest, begin, end);
  case '*':
    return sf_parse_token(dest, begin, end);
  case ':':
    return sf_parse_byteseq(dest, begin, end);
  case '?':
    return sf_parse_boolean(dest, begin, end);
  default:
    if (('A' <= *begin && *begin <= 'Z') || ('a' <= *begin && *begin <= 'z')) {
      return sf_parse_token(dest, begin, end);
    }
    return -1;
  }
}